

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr __thiscall
c4::yml::Parser::_filter_block_scalar
          (Parser *this,substr s,BlockStyle_e style,BlockChomp_e chomp,size_t indentation)

{
  char *pcVar1;
  ulong uVar2;
  char cVar3;
  code *pcVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  Location LVar14;
  Location LVar15;
  Location LVar16;
  Location LVar17;
  Location LVar18;
  Location LVar19;
  Location LVar20;
  char *pcVar21;
  Parser *pPVar22;
  BlockChomp_e BVar23;
  bool bVar24;
  char cVar25;
  bool bVar26;
  size_t sVar27;
  char *extraout_RAX;
  char *pcVar28;
  long lVar29;
  char *pcVar30;
  undefined7 uVar32;
  char *extraout_RAX_00;
  char *pcVar31;
  char *pcVar33;
  long lVar34;
  char *pcVar35;
  size_t extraout_RDX;
  size_t sVar36;
  size_t extraout_RDX_00;
  int iVar37;
  long lVar38;
  char *pcVar39;
  ulong uVar40;
  long lVar41;
  char *pcVar42;
  basic_substring<char> bVar43;
  csubstr cVar44;
  csubstr cVar45;
  ro_substr chars;
  ro_substr chars_00;
  substr dst;
  char msg [32];
  csubstr rem;
  substr local_368;
  char *local_350;
  Parser *local_348;
  uint local_340;
  BlockChomp_e local_33c;
  basic_substring<char> local_338;
  undefined5 local_328;
  undefined3 uStack_323;
  undefined2 uStack_320;
  undefined4 uStack_31e;
  undefined1 uStack_31a;
  undefined1 uStack_319;
  undefined2 local_318;
  undefined4 uStack_316;
  undefined1 uStack_312;
  undefined1 uStack_311;
  undefined2 uStack_310;
  undefined4 uStack_30e;
  undefined1 uStack_30a;
  undefined1 uStack_309;
  undefined6 uStack_308;
  char *local_300;
  basic_substring<char> local_2f8;
  long local_2e8;
  basic_substring<const_char> local_2e0;
  ulong local_2d0;
  ulong local_2c8;
  long local_2c0;
  long local_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  char *pcStack_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  char *pcStack_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  char *pcStack_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  char *pcStack_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  char *pcStack_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  char *pcStack_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  char *pcStack_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  char *pcStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  char *pcStack_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  char *pcStack_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  char *pcStack_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  local_2f8.len = s.len;
  local_2f8.str = s.str;
  if (chomp != CHOMP_KEEP) {
    chars.len = 3;
    chars.str = " \n\r";
    bVar43 = basic_substring<char>::triml(&local_2f8,chars);
    local_338.str = bVar43.str;
    local_338.len._0_5_ = (undefined5)bVar43.len;
    local_338.len._5_3_ = bVar43.len._5_3_;
    chars_00.len = 3;
    chars_00.str = " \n\r";
    bVar43 = basic_substring<char>::trimr(&local_338,chars_00);
    if (bVar43.len == 0) {
      sVar36 = 0;
      pcVar39 = local_2f8.str;
      goto LAB_00236130;
    }
  }
  local_368.len = local_2f8.len;
  local_368.str = local_2f8.str;
  local_348 = this;
  local_33c = chomp;
  local_300 = (char *)indentation;
  if (style == BLOCK_FOLD) {
    pcVar35 = (char *)(local_2f8.len + 2);
    pcVar39 = (char *)(this->m_filter_arena).len;
    if (pcVar39 < pcVar35) {
      pcVar39 = (char *)((long)pcVar39 * 2);
      if (pcVar39 <= pcVar35) {
        pcVar39 = pcVar35;
      }
      pcVar35 = (char *)0x80;
      if ((char *)0x80 < pcVar39) {
        pcVar35 = pcVar39;
      }
      _resize_filter_arena(this,(size_t)pcVar35);
    }
    local_350 = (char *)0x0;
    local_2d0 = 0;
    pcVar35 = (char *)0x0;
    pcVar28 = (char *)basic_substring<char>::first_not_of(&local_368,' ',0);
    pcVar39 = (char *)indentation;
    if (pcVar28 < indentation) {
      pcVar39 = pcVar28;
    }
    uVar40 = local_2d0;
    if (pcVar39 < local_368.len) {
      local_340 = (uint)CONCAT71((int7)((ulong)pcVar28 >> 8),indentation < pcVar28);
      uVar40 = 0;
      local_2c8 = 0;
      do {
        cVar3 = local_368.str[(long)pcVar39];
        bVar24 = true;
        if (cVar3 == '\t') {
LAB_0023536c:
          pcVar35 = (this->m_filter_arena).str;
          pcVar35[(long)local_350] = cVar3;
          local_350 = local_350 + 1;
        }
        else if (cVar3 != '\r') {
          if (cVar3 != '\n') {
            local_2c8 = CONCAT71((int7)((ulong)pcVar35 >> 8),1);
            goto LAB_0023536c;
          }
          lVar41 = -1;
          lVar29 = 1;
          lVar34 = 0;
          pcVar28 = pcVar39;
          do {
            pPVar22 = local_348;
            if (local_368.len <= pcVar28) {
              if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
                pcVar4 = (code *)swi(3);
                cVar44 = (csubstr)(*pcVar4)();
                return cVar44;
              }
              handle_error(0x250c0a,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x14c3,"i >= 0 && i < len");
            }
            pcVar39 = pcVar28;
            if (local_368.str[(long)pcVar28] != '\n') goto LAB_002356c5;
            pcVar31 = pcVar28 + 1;
            if (local_368.len < pcVar31) {
              if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
                pcVar4 = (code *)swi(3);
                cVar44 = (csubstr)(*pcVar4)();
                return cVar44;
              }
              handle_error(0x250c0a,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1533,"first >= 0 && first <= len");
            }
            basic_substring<char>::basic_substring
                      (&local_338,local_368.str + (long)pcVar31,local_368.len - (long)pcVar31);
            local_2e0.len = CONCAT35(local_338.len._5_3_,(undefined5)local_338.len);
            local_2e0.str = local_338.str;
            pcVar35 = (char *)0x0;
            local_2e8 = lVar41;
            local_2b8 = lVar34;
            pcVar30 = (char *)basic_substring<const_char>::first_not_of(&local_2e0,' ',0);
            lVar41 = local_2e8;
            if (pcVar30 == (char *)0xffffffffffffffff) {
              if (local_368.len < pcVar31) {
                local_328 = 0x3d3c20312b;
                uStack_323 = 0x2e7220;
                uStack_320 = 0x656c;
                uStack_31e = CONCAT13(uStack_31e._3_1_,0x296e);
                local_338.str = (char *)0x6166206b63656863;
                local_338.len._0_5_ = 0x3a64656c69;
                local_338.len._5_3_ = 0x692820;
                if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
                  pcVar4 = (code *)swi(3);
                  cVar44 = (csubstr)(*pcVar4)();
                  return cVar44;
                }
                local_198 = 0;
                uStack_190 = 0x7e4f;
                local_188 = 0;
                pcStack_180 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_178 = 0x65;
                pcVar35 = (char *)0x0;
                LVar5.super_LineCol.col = 0;
                LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7e4f) << 0x40,0);
                LVar5.super_LineCol.line = SUB168(ZEXT816(0x7e4f) << 0x40,8);
                LVar5.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar5.name.len = 0x65;
                (*(pPVar22->m_stack).m_callbacks.m_error)
                          ((char *)&local_338,0x1d,LVar5,(pPVar22->m_stack).m_callbacks.m_user_data)
                ;
              }
              pcVar42 = (char *)(local_2e0.len + (long)pcVar28) + 1;
              lVar38 = lVar29;
              if ((char *)local_2e0.len == (char *)0x0) {
                if (pcVar31 != (char *)local_368.len) {
                  local_328 = 0x3d3d20312b;
                  uStack_323 = 0x2e7220;
                  uStack_320 = 0x656c;
                  uStack_31e = CONCAT13(uStack_31e._3_1_,0x296e);
                  local_338.str = (char *)0x6166206b63656863;
                  local_338.len._0_5_ = 0x3a64656c69;
                  local_338.len._5_3_ = 0x692820;
                  if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
                    pcVar4 = (code *)swi(3);
                    cVar44 = (csubstr)(*pcVar4)();
                    return cVar44;
                  }
                  local_1c0 = 0;
                  uStack_1b8 = 0x7e68;
                  local_1b0 = 0;
                  pcStack_1a8 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                  ;
                  local_1a0 = 0x65;
                  pcVar35 = (char *)0x0;
                  LVar8.super_LineCol.col = 0;
                  LVar8.super_LineCol.offset = SUB168(ZEXT816(0x7e68) << 0x40,0);
                  LVar8.super_LineCol.line = SUB168(ZEXT816(0x7e68) << 0x40,8);
                  LVar8.name.str =
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                  ;
                  LVar8.name.len = 0x65;
                  (*(pPVar22->m_stack).m_callbacks.m_error)
                            ((char *)&local_338,0x1d,LVar8,
                             (pPVar22->m_stack).m_callbacks.m_user_data);
                }
                iVar37 = 0x24;
                if ((char *)local_2e0.len != (char *)0x0) {
                  local_328 = 0x656c2e6d65;
                  uStack_323 = 0x3d206e;
                  uStack_320 = 0x203d;
                  uStack_31e = CONCAT13(uStack_31e._3_1_,0x2930);
                  local_338.str = (char *)0x6166206b63656863;
                  local_338.len._0_5_ = 0x3a64656c69;
                  local_338.len._5_3_ = 0x722820;
                  if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
                    pcVar4 = (code *)swi(3);
                    cVar44 = (csubstr)(*pcVar4)();
                    return cVar44;
                  }
                  local_1e8 = 0;
                  uStack_1e0 = 0x7e69;
                  local_1d8 = 0;
                  pcStack_1d0 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                  ;
                  local_1c8 = 0x65;
                  pcVar35 = (char *)0x0;
                  LVar9.super_LineCol.col = 0;
                  LVar9.super_LineCol.offset = SUB168(ZEXT816(0x7e69) << 0x40,0);
                  LVar9.super_LineCol.line = SUB168(ZEXT816(0x7e69) << 0x40,8);
                  LVar9.name.str =
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                  ;
                  LVar9.name.len = 0x65;
                  (*(local_348->m_stack).m_callbacks.m_error)
                            ((char *)&local_338,0x1d,LVar9,
                             (local_348->m_stack).m_callbacks.m_user_data);
                }
              }
              else if (local_2e0.len < local_300) {
                pcVar39 = pcVar28 + local_2e0.len;
                iVar37 = 0x24;
              }
              else {
                pcVar39 = pcVar28 + (long)local_300;
                iVar37 = 0x24;
                if (local_300 < local_2e0.len) {
                  iVar37 = 0x1d;
                }
              }
            }
            else {
              pcVar39 = pcVar30 + (long)pcVar28;
              pcVar35 = pcVar39;
              pcVar33 = pcVar30 + (long)pcVar28 + 1;
              if (pcVar30 + (long)pcVar28 + 1 < local_368.len) {
                pcVar33 = (char *)local_368.len;
              }
              do {
                pcVar1 = pcVar35 + 1;
                pcVar42 = pcVar33;
                if (local_368.len <= pcVar1) break;
                pcVar21 = pcVar35 + 1;
                pcVar35 = pcVar1;
                pcVar42 = pcVar1;
              } while (local_368.str[(long)pcVar21] == '\r');
              local_2c0 = lVar29;
              if (local_2e0.len <= pcVar30) {
                local_328 = 0x2074737269;
                uStack_323 = 0x72203c;
                uStack_320 = 0x6d65;
                uStack_31e = 0x6e656c2e;
                uStack_31a = 0x29;
                uStack_319 = 0;
                local_338.str = (char *)0x6166206b63656863;
                local_338.len._0_5_ = 0x3a64656c69;
                local_338.len._5_3_ = 0x662820;
                if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
                  pcVar4 = (code *)swi(3);
                  cVar44 = (csubstr)(*pcVar4)();
                  return cVar44;
                }
                local_148 = 0;
                uStack_140 = 0x7e33;
                local_138 = 0;
                pcStack_130 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_128 = 0x65;
                pcVar35 = (char *)0x0;
                LVar6.super_LineCol.col = 0;
                LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7e33) << 0x40,0);
                LVar6.super_LineCol.line = SUB168(ZEXT816(0x7e33) << 0x40,8);
                LVar6.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar6.name.len = 0x65;
                (*(pPVar22->m_stack).m_callbacks.m_error)
                          ((char *)&local_338,0x20,LVar6,(pPVar22->m_stack).m_callbacks.m_user_data)
                ;
              }
              if (local_368.len <= pcVar31 + (long)pcVar30) {
                local_328 = 0x69662b312b;
                uStack_323 = 0x747372;
                uStack_320 = 0x3c20;
                uStack_31e = 0x6c2e7220;
                uStack_31a = 0x65;
                uStack_319 = 0x6e;
                local_338.str = (char *)0x6166206b63656863;
                local_338.len._0_5_ = 0x3a64656c69;
                local_338.len._5_3_ = 0x692820;
                local_318 = 0x29;
                if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
                  pcVar4 = (code *)swi(3);
                  cVar44 = (csubstr)(*pcVar4)();
                  return cVar44;
                }
                local_170 = 0;
                uStack_168 = 0x7e34;
                local_160 = 0;
                pcStack_158 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_150 = 0x65;
                pcVar35 = (char *)0x0;
                LVar7.super_LineCol.col = 0;
                LVar7.super_LineCol.offset = SUB168(ZEXT816(0x7e34) << 0x40,0);
                LVar7.super_LineCol.line = SUB168(ZEXT816(0x7e34) << 0x40,8);
                LVar7.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar7.name.len = 0x65;
                (*(pPVar22->m_stack).m_callbacks.m_error)
                          ((char *)&local_338,0x22,LVar7,(pPVar22->m_stack).m_callbacks.m_user_data)
                ;
              }
              lVar41 = local_2e8;
              lVar38 = local_2c0;
              if (local_300 <= pcVar30) {
                pcVar39 = pcVar28 + (long)local_300;
                iVar37 = 0x1d;
                if (local_300 < pcVar30) goto LAB_0023510d;
              }
              if (local_368.len <= pcVar42) {
                if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
                  pcVar4 = (code *)swi(3);
                  cVar44 = (csubstr)(*pcVar4)();
                  return cVar44;
                }
                handle_error(0x250c0a,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             ,0x14c3,"i >= 0 && i < len");
              }
              if (local_368.str[(long)pcVar42] == '\n') {
                pcVar39 = pcVar42;
              }
              iVar37 = 0x1d;
              if (local_368.str[(long)pcVar42] == '\n') {
                iVar37 = 0;
              }
            }
LAB_0023510d:
            pPVar22 = local_348;
            lVar41 = lVar41 + 1;
            lVar29 = lVar38 + 1;
            lVar34 = local_2b8 + 1;
            pcVar28 = pcVar39;
          } while (iVar37 == 0);
          if (iVar37 == 0x24) {
LAB_002356c5:
            if (lVar41 != -1) {
              lVar41 = lVar41 + 1;
              do {
                (local_348->m_filter_arena).str[(long)local_350] = '\n';
                local_350 = local_350 + 1;
                lVar41 = lVar41 + -1;
              } while (lVar41 != 0);
            }
            uVar40 = CONCAT71((int7)((ulong)local_350 >> 8),1);
            bVar24 = false;
            this = local_348;
          }
          else {
            if (iVar37 == 0x1d) {
              pcVar28 = pcVar42;
              if (pcVar42 < local_368.len) {
                do {
                  pcVar28 = pcVar42;
                  if (local_368.str[(long)pcVar42] != '\t') break;
                  pcVar42 = pcVar42 + 1;
                  pcVar28 = (char *)local_368.len;
                } while ((char *)local_368.len != pcVar42);
              }
              if (local_368.len < pcVar28) {
                local_318 = 0x6361;
                uStack_316 = 0x3d3c2065;
                uStack_312 = 0x20;
                uStack_311 = 0x72;
                uStack_310 = 0x6c2e;
                uStack_30e = 0x296e65;
                local_328 = 0x5f74737269;
                uStack_323 = 0x6e6f6e;
                uStack_320 = 0x775f;
                uStack_31e = 0x65746968;
                uStack_31a = 0x73;
                uStack_319 = 0x70;
                local_338.str = (char *)0x6166206b63656863;
                local_338.len._0_5_ = 0x3a64656c69;
                local_338.len._5_3_ = 0x662820;
                if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
                  pcVar4 = (code *)swi(3);
                  cVar44 = (csubstr)(*pcVar4)();
                  return cVar44;
                }
                local_210 = 0;
                uStack_208 = 0x7e7b;
                local_200 = 0;
                pcStack_1f8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_1f0 = 0x65;
                LVar10.super_LineCol.col = 0;
                LVar10.super_LineCol.offset = SUB168(ZEXT816(0x7e7b) << 0x40,0);
                LVar10.super_LineCol.line = SUB168(ZEXT816(0x7e7b) << 0x40,8);
                LVar10.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar10.name.len = 0x65;
                (*(pPVar22->m_stack).m_callbacks.m_error)
                          ((char *)&local_338,0x2e,LVar10,(pPVar22->m_stack).m_callbacks.m_user_data
                          );
              }
              pcVar35 = (char *)0x0;
              pcVar39 = (char *)basic_substring<char>::last_of(&local_368,'\n',(size_t)pcVar28);
              pcVar31 = pcVar39 + 1;
              pcVar30 = pcVar39;
              if (pcVar28 < pcVar31) {
                local_318 = 0x6361;
                uStack_316 = 0x3d3e2065;
                uStack_312 = 0x20;
                uStack_311 = 0x6c;
                uStack_310 = 0x7361;
                uStack_30e = 0x656e5f74;
                local_328 = 0x5f74737269;
                uStack_323 = 0x6e6f6e;
                uStack_320 = 0x775f;
                uStack_31e = 0x65746968;
                uStack_31a = 0x73;
                uStack_319 = 0x70;
                local_338.str = (char *)0x6166206b63656863;
                local_338.len._0_5_ = 0x3a64656c69;
                local_338.len._5_3_ = 0x662820;
                uStack_30a = 0x77;
                uStack_309 = 0x6c;
                uStack_308 = 0x2931202b20;
                if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
                  pcVar4 = (code *)swi(3);
                  cVar44 = (csubstr)(*pcVar4)();
                  return cVar44;
                }
                local_238 = 0;
                uStack_230 = 0x7e7f;
                local_228 = 0;
                pcStack_220 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_218 = 0x65;
                pcVar35 = (char *)0x0;
                LVar11.super_LineCol.col = 0;
                LVar11.super_LineCol.offset = SUB168(ZEXT816(0x7e7f) << 0x40,0);
                LVar11.super_LineCol.line = SUB168(ZEXT816(0x7e7f) << 0x40,8);
                LVar11.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar11.name.len = 0x65;
                pcVar30 = (char *)(*(pPVar22->m_stack).m_callbacks.m_error)
                                            ((char *)&local_338,0x36,LVar11,
                                             (pPVar22->m_stack).m_callbacks.m_user_data);
              }
              pcVar42 = pcVar28 + ~(ulong)pcVar39;
              if (pcVar42 < local_300) {
                local_318 = 0x3d3e;
                uStack_316 = 0x646e6920;
                uStack_312 = 0x65;
                uStack_311 = 0x6e;
                uStack_310 = 0x6174;
                uStack_30e = 0x6e6f6974;
                uStack_30a = 0x29;
                uStack_309 = 0;
                local_328 = 0x695f736968;
                uStack_323 = 0x65646e;
                uStack_320 = 0x746e;
                uStack_31e = 0x6f697461;
                uStack_31a = 0x6e;
                uStack_319 = 0x20;
                local_338.str = (char *)0x6166206b63656863;
                local_338.len._0_5_ = 0x3a64656c69;
                local_338.len._5_3_ = 0x742820;
                if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
                  pcVar4 = (code *)swi(3);
                  cVar44 = (csubstr)(*pcVar4)();
                  return cVar44;
                }
                local_260 = 0;
                uStack_258 = 0x7e80;
                local_250 = 0;
                pcStack_248 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_240 = 0x65;
                pcVar35 = (char *)0x0;
                LVar12.super_LineCol.col = 0;
                LVar12.super_LineCol.offset = SUB168(ZEXT816(0x7e80) << 0x40,0);
                LVar12.super_LineCol.line = SUB168(ZEXT816(0x7e80) << 0x40,8);
                LVar12.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar12.name.len = 0x65;
                pcVar30 = (char *)(*(local_348->m_stack).m_callbacks.m_error)
                                            ((char *)&local_338,0x30,LVar12,
                                             (local_348->m_stack).m_callbacks.m_user_data);
              }
              pcVar33 = local_300;
              this = local_348;
              if ((local_2c8 & 1) != 0) {
                if (pcVar42 == local_300) {
                  if ((local_340 & 1) == 0) {
                    lVar29 = local_2b8;
                    if (lVar41 == 0) {
                      pcVar39 = (local_348->m_filter_arena).str;
                      pcVar39[(long)local_350] = ' ';
                      local_350 = local_350 + 1;
                    }
                    else {
                      do {
                        (local_348->m_filter_arena).str[(long)local_350] = '\n';
                        local_350 = local_350 + 1;
                        lVar29 = lVar29 + -1;
                        pcVar39 = local_350;
                      } while (lVar29 != 0);
                    }
                    uVar32 = (undefined7)((ulong)pcVar39 >> 8);
                  }
                  else {
                    if (lVar41 != -1) {
                      do {
                        (local_348->m_filter_arena).str[(long)local_350] = '\n';
                        local_350 = local_350 + 1;
                        lVar38 = lVar38 + -1;
                        pcVar30 = local_350;
                      } while (lVar38 != 0);
                    }
                    pcVar31 = pcVar31 + (long)local_300;
                    pcVar39 = pcVar31;
                    for (; pcVar31 < pcVar28; pcVar31 = pcVar31 + 1) {
                      if (local_368.str[(long)pcVar31] != '\r') {
                        (local_348->m_filter_arena).str[(long)local_350] =
                             local_368.str[(long)pcVar31];
                        local_350 = local_350 + 1;
                      }
                      pcVar39 = pcVar28;
                      pcVar30 = local_350;
                    }
                    uVar32 = (undefined7)((ulong)pcVar30 >> 8);
                    local_340 = 0;
                    pcVar28 = pcVar39;
                  }
                }
                else {
                  if (pcVar42 <= local_300) {
                    local_318 = 0x203e;
                    uStack_316 = 0x65646e69;
                    uStack_312 = 0x6e;
                    uStack_311 = 0x74;
                    uStack_310 = 0x7461;
                    uStack_30e = 0x296e6f69;
                    uStack_30a = 0;
                    local_328 = 0x695f736968;
                    uStack_323 = 0x65646e;
                    uStack_320 = 0x746e;
                    uStack_31e = 0x6f697461;
                    uStack_31a = 0x6e;
                    uStack_319 = 0x20;
                    local_338.str = (char *)0x6166206b63656863;
                    local_338.len._0_5_ = 0x3a64656c69;
                    local_338.len._5_3_ = 0x742820;
                    if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
                      pcVar4 = (code *)swi(3);
                      cVar44 = (csubstr)(*pcVar4)();
                      return cVar44;
                    }
                    local_288 = 0;
                    uStack_280 = 0x7eb1;
                    local_278 = 0;
                    pcStack_270 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                    ;
                    local_268 = 0x65;
                    pcVar35 = (char *)0x0;
                    LVar13.super_LineCol.col = 0;
                    LVar13.super_LineCol.offset = SUB168(ZEXT816(0x7eb1) << 0x40,0);
                    LVar13.super_LineCol.line = SUB168(ZEXT816(0x7eb1) << 0x40,8);
                    LVar13.name.str =
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                    ;
                    LVar13.name.len = 0x65;
                    pcVar30 = (char *)(*(this->m_stack).m_callbacks.m_error)
                                                ((char *)&local_338,0x2f,LVar13,
                                                 (this->m_stack).m_callbacks.m_user_data);
                  }
                  if (lVar41 != -1) {
                    do {
                      (this->m_filter_arena).str[(long)local_350] = '\n';
                      local_350 = local_350 + 1;
                      lVar38 = lVar38 + -1;
                      pcVar30 = local_350;
                    } while (lVar38 != 0);
                  }
                  pcVar31 = pcVar31 + (long)pcVar33;
                  pcVar39 = pcVar31;
                  for (; pcVar31 < pcVar28; pcVar31 = pcVar31 + 1) {
                    if (local_368.str[(long)pcVar31] != '\r') {
                      (this->m_filter_arena).str[(long)local_350] = local_368.str[(long)pcVar31];
                      local_350 = local_350 + 1;
                    }
                    pcVar39 = pcVar28;
                    pcVar30 = local_350;
                  }
                  uVar32 = (undefined7)((ulong)pcVar30 >> 8);
                  local_340 = (uint)CONCAT71(uVar32,1);
                  pcVar28 = pcVar39;
                }
                pcVar39 = pcVar28 + -1;
                uVar40 = CONCAT71(uVar32,1);
                bVar24 = true;
                goto LAB_002358ea;
              }
              if (local_2e8 != -2) {
                do {
                  (local_348->m_filter_arena).str[(long)local_350] = '\n';
                  local_350 = local_350 + 1;
                  lVar38 = lVar38 + -1;
                } while (lVar38 != 0);
              }
              uVar32 = (undefined7)((ulong)local_300 >> 8);
              if (local_300 < pcVar42) {
                pcVar39 = pcVar39 + (long)local_300;
                local_340 = (uint)CONCAT71(uVar32,1);
              }
              else {
                pcVar39 = pcVar28 + -1;
              }
              bVar24 = true;
            }
            else {
              uVar32 = (undefined7)((ulong)lVar29 >> 8);
              bVar24 = false;
            }
            uVar40 = CONCAT71(uVar32,1);
            this = local_348;
          }
        }
LAB_002358ea:
        if (!bVar24) break;
        pcVar39 = pcVar39 + 1;
      } while (pcVar39 < local_368.len);
    }
    local_2d0 = uVar40;
    BVar23 = local_33c;
    if ((char *)(this->m_filter_arena).len < local_350) {
      local_318 = 0x6572;
      uStack_316 = 0x6c2e616e;
      uStack_312 = 0x65;
      uStack_311 = 0x6e;
      uStack_310 = 0x29;
      local_328 = 0x3d3c20736f;
      uStack_323 = 0x5f6d20;
      uStack_320 = 0x6966;
      uStack_31e = 0x7265746c;
      uStack_31a = 0x5f;
      uStack_319 = 0x61;
      local_338.str = (char *)0x6166206b63656863;
      local_338.len._0_5_ = 0x3a64656c69;
      local_338.len._5_3_ = 0x702820;
      if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
        pcVar4 = (code *)swi(3);
        cVar44 = (csubstr)(*pcVar4)();
        return cVar44;
      }
      local_2b0 = 0;
      uStack_2a8 = 0x7ebd;
      local_2a0 = 0;
      pcStack_298 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_290 = 0x65;
      LVar14.super_LineCol.col = 0;
      LVar14.super_LineCol.offset = SUB168(ZEXT816(0x7ebd) << 0x40,0);
      LVar14.super_LineCol.line = SUB168(ZEXT816(0x7ebd) << 0x40,8);
      LVar14.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar14.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_338,0x2a,LVar14,(this->m_stack).m_callbacks.m_user_data);
    }
    bVar24 = _apply_chomp(this,this->m_filter_arena,(size_t *)&local_350,BVar23);
    pcVar39 = local_350;
    if ((local_350 < local_368.len) || (bVar24 || (local_2d0 & 1) != 0)) {
LAB_00236117:
      dst.len = local_2f8.len;
      dst.str = local_2f8.str;
      local_368 = _finish_filter_arena(this,dst,(size_t)pcVar39);
    }
  }
  else if (style == BLOCK_LITERAL) {
    sVar27 = basic_substring<char>::first_not_of(&local_368,' ',0);
    if (sVar27 == 0xffffffffffffffff) {
      sVar36 = 0;
      pcVar39 = local_368.str;
      if ((chomp == CHOMP_KEEP) && (local_368.len != 0)) {
        *local_368.str = '\n';
        if (local_368.len == 0) {
          if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
            pcVar4 = (code *)swi(3);
            cVar44 = (csubstr)(*pcVar4)();
            return cVar44;
          }
          handle_error(0x250c0a,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x154e,"num <= len || num == npos");
        }
        basic_substring<char>::basic_substring(&local_338,local_368.str,1);
        sVar36 = CONCAT35(local_338.len._5_3_,(undefined5)local_338.len);
        pcVar39 = local_338.str;
      }
    }
    else {
      if (indentation < sVar27) {
        if (local_368.len < indentation) {
          if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
            pcVar4 = (code *)swi(3);
            cVar44 = (csubstr)(*pcVar4)();
            return cVar44;
          }
          handle_error(0x250c0a,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<char>::basic_substring
                  (&local_338,local_368.str + indentation,local_368.len - indentation);
        pcVar39 = extraout_RAX;
        sVar36 = extraout_RDX;
      }
      else {
        if (local_368.len < sVar27) {
          if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
            pcVar4 = (code *)swi(3);
            cVar44 = (csubstr)(*pcVar4)();
            return cVar44;
          }
          handle_error(0x250c0a,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<char>::basic_substring
                  (&local_338,local_368.str + sVar27,local_368.len - sVar27);
        pcVar39 = extraout_RAX_00;
        sVar36 = extraout_RDX_00;
      }
      local_368.len._5_3_ = local_338.len._5_3_;
      local_368.len._0_5_ = (undefined5)local_338.len;
      local_368.str = local_338.str;
    }
    if (sVar27 == 0xffffffffffffffff) goto LAB_00236130;
    pcVar35 = (char *)(local_2f8.len + 2);
    pcVar39 = (char *)(this->m_filter_arena).len;
    if (pcVar39 < pcVar35) {
      pcVar39 = (char *)((long)pcVar39 * 2);
      if (pcVar39 <= pcVar35) {
        pcVar39 = pcVar35;
      }
      pcVar35 = (char *)0x80;
      if ((char *)0x80 < pcVar39) {
        pcVar35 = pcVar39;
      }
      _resize_filter_arena(this,(size_t)pcVar35);
    }
    local_350 = (char *)0x0;
    if (local_368.len == 0) {
      pcVar39 = (char *)0x0;
    }
    else {
      uVar40 = 0;
      pcVar35 = (char *)0x0;
      do {
        cVar3 = local_368.str[uVar40];
        cVar25 = '\x05';
        pcVar39 = pcVar35;
        if (cVar3 != '\r') {
          pcVar28 = pcVar35 + 1;
          (this->m_filter_arena).str[(long)pcVar35] = cVar3;
          cVar25 = '\0';
          pcVar39 = pcVar28;
          if (cVar3 == '\n') {
            uVar2 = uVar40 + 1;
            if (local_368.len < uVar2) {
              if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
                pcVar4 = (code *)swi(3);
                cVar44 = (csubstr)(*pcVar4)();
                return cVar44;
              }
              handle_error(0x250c0a,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1533,"first >= 0 && first <= len");
            }
            basic_substring<char>::basic_substring
                      (&local_338,local_368.str + uVar2,local_368.len - uVar2);
            local_2e0.len = CONCAT35(local_338.len._5_3_,(undefined5)local_338.len);
            local_2e0.str = local_338.str;
            pcVar31 = (char *)basic_substring<const_char>::first_not_of(&local_2e0,' ',0);
            if (pcVar31 == (char *)0xffffffffffffffff) {
              if (local_368.len < uVar2) {
                local_328 = 0x3d3c20312b;
                uStack_323 = 0x2e7220;
                uStack_320 = 0x656c;
                uStack_31e = CONCAT13(uStack_31e._3_1_,0x296e);
                local_338.str = (char *)0x6166206b63656863;
                local_338.len._0_5_ = 0x3a64656c69;
                local_338.len._5_3_ = 0x692820;
                if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
                  pcVar4 = (code *)swi(3);
                  cVar44 = (csubstr)(*pcVar4)();
                  return cVar44;
                }
                local_a8 = 0;
                uStack_a0 = 0x7ddc;
                local_98 = 0;
                pcStack_90 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_88 = 0x65;
                LVar17.super_LineCol.col = 0;
                LVar17.super_LineCol.offset = SUB168(ZEXT816(0x7ddc) << 0x40,0);
                LVar17.super_LineCol.line = SUB168(ZEXT816(0x7ddc) << 0x40,8);
                LVar17.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar17.name.len = 0x65;
                (*(local_348->m_stack).m_callbacks.m_error)
                          ((char *)&local_338,0x1d,LVar17,
                           (local_348->m_stack).m_callbacks.m_user_data);
              }
              this = local_348;
              if ((char *)local_2e0.len == (char *)0x0) {
                if (local_33c != CHOMP_STRIP) {
                  pcVar35 = pcVar28;
                }
                if (uVar2 == local_368.len) {
                  pcVar28 = pcVar35;
                }
                cVar25 = (uVar2 == local_368.len) * '\x03';
                pcVar39 = pcVar28;
              }
              else {
                cVar25 = '\x03';
                pcVar39 = pcVar35;
                if (local_300 <= local_2e0.len) {
                  uVar40 = uVar40 + (long)local_300;
                  cVar25 = '\0';
                  pcVar39 = pcVar28;
                }
              }
            }
            else {
              if (local_2e0.len <= pcVar31) {
                local_328 = 0x2074737269;
                uStack_323 = 0x72203c;
                uStack_320 = 0x6d65;
                uStack_31e = 0x6e656c2e;
                uStack_31a = 0x29;
                uStack_319 = 0;
                local_338.str = (char *)0x6166206b63656863;
                local_338.len._0_5_ = 0x3a64656c69;
                local_338.len._5_3_ = 0x662820;
                if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
                  pcVar4 = (code *)swi(3);
                  cVar44 = (csubstr)(*pcVar4)();
                  return cVar44;
                }
                local_58 = 0;
                uStack_50 = 0x7dcc;
                local_48 = 0;
                pcStack_40 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_38 = 0x65;
                LVar15.super_LineCol.col = 0;
                LVar15.super_LineCol.offset = SUB168(ZEXT816(0x7dcc) << 0x40,0);
                LVar15.super_LineCol.line = SUB168(ZEXT816(0x7dcc) << 0x40,8);
                LVar15.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar15.name.len = 0x65;
                (*(local_348->m_stack).m_callbacks.m_error)
                          ((char *)&local_338,0x20,LVar15,
                           (local_348->m_stack).m_callbacks.m_user_data);
              }
              this = local_348;
              if (local_368.len <= uVar2 + (long)pcVar31) {
                local_328 = 0x69662b312b;
                uStack_323 = 0x747372;
                uStack_320 = 0x3c20;
                uStack_31e = 0x6c2e7220;
                uStack_31a = 0x65;
                uStack_319 = 0x6e;
                local_338.str = (char *)0x6166206b63656863;
                local_338.len._0_5_ = 0x3a64656c69;
                local_338.len._5_3_ = 0x692820;
                local_318 = 0x29;
                if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
                  pcVar4 = (code *)swi(3);
                  cVar44 = (csubstr)(*pcVar4)();
                  return cVar44;
                }
                local_80 = 0;
                uStack_78 = 0x7dcd;
                local_70 = 0;
                pcStack_68 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_60 = 0x65;
                LVar16.super_LineCol.col = 0;
                LVar16.super_LineCol.offset = SUB168(ZEXT816(0x7dcd) << 0x40,0);
                LVar16.super_LineCol.line = SUB168(ZEXT816(0x7dcd) << 0x40,8);
                LVar16.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar16.name.len = 0x65;
                (*(this->m_stack).m_callbacks.m_error)
                          ((char *)&local_338,0x22,LVar16,(this->m_stack).m_callbacks.m_user_data);
              }
              pcVar35 = local_300;
              if (pcVar31 < local_300) {
                pcVar35 = pcVar31;
              }
              uVar40 = uVar40 + (long)pcVar35;
              cVar25 = '\0';
            }
          }
        }
        if ((cVar25 != '\x05') && (cVar25 != '\0')) break;
        uVar40 = uVar40 + 1;
        pcVar35 = pcVar39;
      } while (uVar40 < local_368.len);
    }
    BVar23 = local_33c;
    local_350 = pcVar39;
    if (local_2f8.len < pcVar39) {
      local_328 = 0x206e656c2e;
      uStack_323 = 0x203d3e;
      uStack_320 = 0x6f70;
      uStack_31e = CONCAT13(uStack_31e._3_1_,0x2973);
      local_338.str = (char *)0x6166206b63656863;
      local_338.len._0_5_ = 0x3a64656c69;
      local_338.len._5_3_ = 0x732820;
      if (((s_error_flags & 1) != 0) && (bVar24 = is_debugger_attached(), bVar24)) {
        pcVar4 = (code *)swi(3);
        cVar44 = (csubstr)(*pcVar4)();
        return cVar44;
      }
      local_d0 = 0;
      uStack_c8 = 0x7df6;
      local_c0 = 0;
      pcStack_b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_b0 = 0x65;
      LVar18.super_LineCol.col = 0;
      LVar18.super_LineCol.offset = SUB168(ZEXT816(0x7df6) << 0x40,0);
      LVar18.super_LineCol.line = SUB168(ZEXT816(0x7df6) << 0x40,8);
      LVar18.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar18.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_338,0x1d,LVar18,(this->m_stack).m_callbacks.m_user_data);
    }
    bVar24 = _apply_chomp(this,this->m_filter_arena,(size_t *)&local_350,BVar23);
    pcVar39 = local_350;
    if ((char *)(this->m_filter_arena).len < local_350) {
      local_318 = 0x6572;
      uStack_316 = 0x6c2e616e;
      uStack_312 = 0x65;
      uStack_311 = 0x6e;
      uStack_310 = 0x29;
      local_328 = 0x3d3c20736f;
      uStack_323 = 0x5f6d20;
      uStack_320 = 0x6966;
      uStack_31e = 0x7265746c;
      uStack_31a = 0x5f;
      uStack_319 = 0x61;
      local_338.str = (char *)0x6166206b63656863;
      local_338.len._0_5_ = 0x3a64656c69;
      local_338.len._5_3_ = 0x702820;
      if (((s_error_flags & 1) != 0) && (bVar26 = is_debugger_attached(), bVar26)) {
        pcVar4 = (code *)swi(3);
        cVar44 = (csubstr)(*pcVar4)();
        return cVar44;
      }
      local_f8 = 0;
      uStack_f0 = 0x7df9;
      local_e8 = 0;
      pcStack_e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_d8 = 0x65;
      LVar19.super_LineCol.col = 0;
      LVar19.super_LineCol.offset = SUB168(ZEXT816(0x7df9) << 0x40,0);
      LVar19.super_LineCol.line = SUB168(ZEXT816(0x7df9) << 0x40,8);
      LVar19.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar19.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_338,0x2a,LVar19,(this->m_stack).m_callbacks.m_user_data);
    }
    if (local_2f8.len < pcVar39) {
      local_328 = 0x3d3c20736f;
      uStack_323 = 0x2e7320;
      uStack_320 = 0x656c;
      uStack_31e = CONCAT13(uStack_31e._3_1_,0x296e);
      local_338.str = (char *)0x6166206b63656863;
      local_338.len._0_5_ = 0x3a64656c69;
      local_338.len._5_3_ = 0x702820;
      if (((s_error_flags & 1) != 0) && (bVar26 = is_debugger_attached(), bVar26)) {
        pcVar4 = (code *)swi(3);
        cVar44 = (csubstr)(*pcVar4)();
        return cVar44;
      }
      local_120 = 0;
      uStack_118 = 0x7dfa;
      local_110 = 0;
      pcStack_108 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_100 = 0x65;
      LVar20.super_LineCol.col = 0;
      LVar20.super_LineCol.offset = SUB168(ZEXT816(0x7dfa) << 0x40,0);
      LVar20.super_LineCol.line = SUB168(ZEXT816(0x7dfa) << 0x40,8);
      LVar20.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar20.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_338,0x1d,LVar20,(this->m_stack).m_callbacks.m_user_data);
    }
    if ((~bVar24 & local_368.len <= pcVar39) == 0) goto LAB_00236117;
  }
  else {
    bVar24 = is_debugger_attached();
    if ((bVar24) && (bVar24 = is_debugger_attached(), bVar24)) {
      pcVar4 = (code *)swi(3);
      cVar44 = (csubstr)(*pcVar4)();
      return cVar44;
    }
    cVar44.len = 0x1a;
    cVar44.str = "ERROR: unknown block style";
    _err<>(this,cVar44);
  }
  pcVar39 = local_368.str;
  sVar36 = local_368.len;
LAB_00236130:
  cVar45.len = sVar36;
  cVar45.str = pcVar39;
  return cVar45;
}

Assistant:

csubstr Parser::_filter_block_scalar(substr s, BlockStyle_e style, BlockChomp_e chomp, size_t indentation)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfbl(fmt, ...) _c4dbgpf("filt_block" fmt, __VA_ARGS__)
    #else
    #define _c4dbgfbl(...)
    #endif

    _c4dbgfbl(": indentation={} before=[{}]~~~{}~~~", indentation, s.len, s);

    if(chomp != CHOMP_KEEP && s.trim(" \n\r").len == 0u)
    {
        _c4dbgp("filt_block: empty scalar");
        return s.first(0);
    }

    substr r = s;

    switch(style)
    {
    case BLOCK_LITERAL:
        {
            _c4dbgp("filt_block: style=literal");
            // trim leading whitespace up to indentation
            {
                size_t numws = r.first_not_of(' ');
                if(numws != npos)
                {
                    if(numws > indentation)
                        r = r.sub(indentation);
                    else
                        r = r.sub(numws);
                    _c4dbgfbl(": after triml=[{}]~~~{}~~~", r.len, r);
                }
                else
                {
                    if(chomp != CHOMP_KEEP || r.len == 0)
                    {
                        _c4dbgfbl(": all spaces {}, return empty", r.len);
                        return r.first(0);
                    }
                    else
                    {
                        r[0] = '\n';
                        return r.first(1);
                    }
                }
            }
            _grow_filter_arena(s.len + 2u);  // use s.len! because we may need to add a newline at the end, so the leading indentation will allow space for that newline
            size_t pos = 0; // the filtered size
            for(size_t i = 0; i < r.len; ++i)
            {
                const char curr = r.str[i];
                _c4dbgfbl("[{}]='{}'  pos={}", i, _c4prc(curr), pos);
                if(curr == '\r')
                    continue;
                m_filter_arena.str[pos++] = curr;
                if(curr == '\n')
                {
                    _c4dbgfbl("[{}]: found newline", i);
                    // skip indentation on the next line
                    csubstr rem = r.sub(i+1);
                    size_t first = rem.first_not_of(' ');
                    if(first != npos)
                    {
                        _RYML_CB_ASSERT(m_stack.m_callbacks, first < rem.len);
                        _RYML_CB_ASSERT(m_stack.m_callbacks, i+1+first < r.len);
                        _c4dbgfbl("[{}]: {} spaces follow before next nonws character @ [{}]='{}'", i, first, i+1+first, rem.str[first]);
                        if(first < indentation)
                        {
                            _c4dbgfbl("[{}]: skip {}<{} spaces from indentation", i, first, indentation);
                            i += first;
                        }
                        else
                        {
                            _c4dbgfbl("[{}]: skip {} spaces from indentation", i, indentation);
                            i += indentation;
                        }
                    }
                    else
                    {
                        _RYML_CB_ASSERT(m_stack.m_callbacks, i+1 <= r.len);
                        first = rem.len;
                        _c4dbgfbl("[{}]: {} spaces to the end", i, first);
                        if(first)
                        {
                            if(first < indentation)
                            {
                                _c4dbgfbl("[{}]: skip everything", i);
                                --pos;
                                break;
                            }
                            else
                            {
                                _c4dbgfbl("[{}]: skip {} spaces from indentation", i, indentation);
                                i += indentation;
                            }
                        }
                        else if(i+1 == r.len)
                        {
                            if(chomp == CHOMP_STRIP)
                                --pos;
                            break;
                        }
                    }
                }
            }
            _RYML_CB_ASSERT(m_stack.m_callbacks, s.len >= pos);
            _c4dbgfbl(": #filteredchars={} after=~~~{}~~~", s.len - r.len, r);
            bool changed = _apply_chomp(m_filter_arena, &pos, chomp);
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= s.len);
            if(pos < r.len || changed)
            {
                r = _finish_filter_arena(s, pos); // write into s
            }
            break;
        }
    case BLOCK_FOLD:
        {
            _c4dbgp("filt_block: style=fold");
            _grow_filter_arena(r.len + 2);
            size_t pos = 0; // the filtered size
            bool filtered_chars = false;
            bool started = false;
            bool is_indented = false;
            size_t i = r.first_not_of(' ');
            _c4dbgfbl(": first non space at {}", i);
            if(i > indentation)
            {
                is_indented = true;
                i = indentation;
            }
            _c4dbgfbl(": start folding at {}, is_indented={}", i, (int)is_indented);
            auto on_change_indentation = [&](size_t numnl_following, size_t last_newl, size_t first_non_whitespace){
                _c4dbgfbl("[{}]: add 1+{} newlines", i, numnl_following);
                for(size_t j = 0; j < 1 + numnl_following; ++j)
                    m_filter_arena.str[pos++] = '\n';
                for(i = last_newl + 1 + indentation; i < first_non_whitespace; ++i)
                {
                    if(r.str[i] == '\r')
                        continue;
                    _c4dbgfbl("[{}]: add '{}'", i, _c4prc(r.str[i]));
                    m_filter_arena.str[pos++] = r.str[i];
                }
                --i;
            };
            for( ; i < r.len; ++i)
            {
                const char curr = r.str[i];
                _c4dbgfbl("[{}]='{}'", i, _c4prc(curr));
                if(curr == '\n')
                {
                    filtered_chars = true;
                    // skip indentation on the next line, and advance over the next non-indented blank lines as well
                    size_t first_non_whitespace;
                    size_t numnl_following = (size_t)-1;
                    while(r[i] == '\n')
                    {
                        ++numnl_following;
                        csubstr rem = r.sub(i+1);
                        size_t first = rem.first_not_of(' ');
                        _c4dbgfbl("[{}]: found newline. first={} rem.len={}", i, first, rem.len);
                        if(first != npos)
                        {
                            first_non_whitespace = first + i+1;
                            while(first_non_whitespace < r.len && r[first_non_whitespace] == '\r')
                                ++first_non_whitespace;
                            _RYML_CB_ASSERT(m_stack.m_callbacks, first < rem.len);
                            _RYML_CB_ASSERT(m_stack.m_callbacks, i+1+first < r.len);
                            _c4dbgfbl("[{}]: {} spaces follow before next nonws character @ [{}]='{}'", i, first, i+1+first, _c4prc(rem.str[first]));
                            if(first < indentation)
                            {
                                _c4dbgfbl("[{}]: skip {}<{} spaces from indentation", i, first, indentation);
                                i += first;
                            }
                            else
                            {
                                _c4dbgfbl("[{}]: skip {} spaces from indentation", i, indentation);
                                i += indentation;
                                if(first > indentation)
                                {
                                    _c4dbgfbl("[{}]: {} further indented than {}, stop newlining", i, first, indentation);
                                    goto finished_counting_newlines;
                                }
                            }
                            // prepare the next while loop iteration
                            // by setting i at the next newline after
                            // an empty line
                            if(r[first_non_whitespace] == '\n')
                                i = first_non_whitespace;
                            else
                                goto finished_counting_newlines;
                        }
                        else
                        {
                            _RYML_CB_ASSERT(m_stack.m_callbacks, i+1 <= r.len);
                            first = rem.len;
                            first_non_whitespace = first + i+1;
                            if(first)
                            {
                                _c4dbgfbl("[{}]: {} spaces to the end", i, first);
                                if(first < indentation)
                                {
                                    _c4dbgfbl("[{}]: skip everything", i);
                                    i += first;
                                }
                                else
                                {
                                    _c4dbgfbl("[{}]: skip {} spaces from indentation", i, indentation);
                                    i += indentation;
                                    if(first > indentation)
                                    {
                                        _c4dbgfbl("[{}]: {} spaces missing. not done yet", i, indentation - first);
                                        goto finished_counting_newlines;
                                    }
                                }
                            }
                            else // if(i+1 == r.len)
                            {
                                _c4dbgfbl("[{}]: it's the final newline", i);
                                _RYML_CB_ASSERT(m_stack.m_callbacks, i+1 == r.len);
                                _RYML_CB_ASSERT(m_stack.m_callbacks, rem.len == 0);
                            }
                            goto end_of_scalar;
                        }
                    }
                end_of_scalar:
                    // Write all the trailing newlines. Since we're
                    // at the end no folding is needed, so write every
                    // newline (add 1).
                    _c4dbgfbl("[{}]: add {} trailing newlines", i, 1+numnl_following);
                    for(size_t j = 0; j < 1 + numnl_following; ++j)
                        m_filter_arena.str[pos++] = '\n';
                    break;
                finished_counting_newlines:
                    _c4dbgfbl("[{}]: #newlines={} firstnonws={}", i, numnl_following, first_non_whitespace);
                    while(first_non_whitespace < r.len && r[first_non_whitespace] == '\t')
                        ++first_non_whitespace;
                    _c4dbgfbl("[{}]: #newlines={} firstnonws={}", i, numnl_following, first_non_whitespace);
                    _RYML_CB_ASSERT(m_stack.m_callbacks, first_non_whitespace <= r.len);
                    size_t last_newl = r.last_of('\n', first_non_whitespace);
                    size_t this_indentation = first_non_whitespace - last_newl - 1;
                    _c4dbgfbl("[{}]: #newlines={} firstnonws={} lastnewl={} this_indentation={} vs indentation={}", i, numnl_following, first_non_whitespace, last_newl, this_indentation, indentation);
                    _RYML_CB_ASSERT(m_stack.m_callbacks, first_non_whitespace >= last_newl + 1);
                    _RYML_CB_ASSERT(m_stack.m_callbacks, this_indentation >= indentation);
                    if(!started)
                    {
                        _c4dbgfbl("[{}]: #newlines={}. write all leading newlines", i, numnl_following);
                        for(size_t j = 0; j < 1 + numnl_following; ++j)
                            m_filter_arena.str[pos++] = '\n';
                        if(this_indentation > indentation)
                        {
                            is_indented = true;
                            _c4dbgfbl("[{}]: advance ->{}", i, last_newl + indentation);
                            i = last_newl + indentation;
                        }
                        else
                        {
                            i = first_non_whitespace - 1;
                            _c4dbgfbl("[{}]: advance ->{}", i, first_non_whitespace);
                        }
                    }
                    else if(this_indentation == indentation)
                    {
                        _c4dbgfbl("[{}]: same indentation", i);
                        if(!is_indented)
                        {
                            if(numnl_following == 0)
                            {
                                _c4dbgfbl("[{}]: fold!", i);
                                m_filter_arena.str[pos++] = ' ';
                            }
                            else
                            {
                                _c4dbgfbl("[{}]: add {} newlines", i, 1 + numnl_following);
                                for(size_t j = 0; j < numnl_following; ++j)
                                    m_filter_arena.str[pos++] = '\n';
                            }
                            i = first_non_whitespace - 1;
                            _c4dbgfbl("[{}]: advance {}->{}", i, i, first_non_whitespace);
                        }
                        else
                        {
                            _c4dbgfbl("[{}]: back to ref indentation", i);
                            is_indented = false;
                            on_change_indentation(numnl_following, last_newl, first_non_whitespace);
                            _c4dbgfbl("[{}]: advance {}->{}", i, i, first_non_whitespace);
                        }
                    }
                    else
                    {
                        _c4dbgfbl("[{}]: increased indentation.", i);
                        is_indented = true;
                        _RYML_CB_ASSERT(m_stack.m_callbacks, this_indentation > indentation);
                        on_change_indentation(numnl_following, last_newl, first_non_whitespace);
                        _c4dbgfbl("[{}]: advance {}->{}", i, i, first_non_whitespace);
                    }
                }
                else if(curr != '\r')
                {
                    if(curr != '\t')
                        started = true;
                    m_filter_arena.str[pos++] = curr;
                }
            }
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
            _c4dbgfbl(": #filteredchars={} after=[{}]~~~{}~~~", (int)s.len - (int)pos, pos, m_filter_arena.first(pos));
            bool changed = _apply_chomp(m_filter_arena, &pos, chomp);
            if(pos < r.len || filtered_chars || changed)
            {
                r = _finish_filter_arena(s, pos); // write into s
            }
        }
        break;
    default:
        _c4err("unknown block style");
    }

    _c4dbgfbl(": final=[{}]~~~{}~~~", r.len, r);

    #undef _c4dbgfbl

    return r;
}